

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Error __thiscall llvm::sys::fs::TempFile::keep(TempFile *this,Twine *Name)

{
  Child *Str;
  int iVar1;
  int iVar2;
  int *piVar3;
  Twine *in_RDX;
  error_category *extraout_RDX;
  error_category *peVar4;
  error_category *extraout_RDX_00;
  StringRef Filename;
  error_code eVar5;
  Twine TStack_48;
  
  if ((Name->LHS).character != '\x01') {
    (Name->LHS).character = '\x01';
    Str = &Name->RHS;
    Twine::Twine(&TStack_48,(string *)Str);
    iVar1 = rename((char *)&TStack_48,(char *)in_RDX);
    if (iVar1 == 0) {
      iVar1 = 0;
      peVar4 = extraout_RDX;
    }
    else {
      Twine::Twine(&TStack_48,(string *)Str);
      eVar5 = copy_file(&TStack_48,in_RDX);
      peVar4 = eVar5._M_cat;
      iVar1 = eVar5._M_value;
      if (iVar1 != 0) {
        Twine::Twine(&TStack_48,(string *)Str);
        remove((fs *)&TStack_48,(char *)0x1);
        peVar4 = extraout_RDX_00;
      }
    }
    Filename.Length = (size_t)peVar4;
    Filename.Data = *(char **)&Name->LHSKind;
    DontRemoveFileOnSignal((sys *)(Name->RHS).twine,Filename);
    if (iVar1 == 0) {
      std::__cxx11::string::_M_replace((ulong)Str,0,*(char **)&Name->LHSKind,0x1b0f5f);
    }
    iVar2._0_1_ = Name[1].LHSKind;
    iVar2._1_1_ = Name[1].RHSKind;
    iVar2._2_2_ = *(undefined2 *)&Name[1].field_0x12;
    iVar2 = close(iVar2);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      std::_V2::generic_category();
    }
    else {
      Name[1].LHSKind = ~NullKind;
      Name[1].RHSKind = ~NullKind;
      *(undefined2 *)&Name[1].field_0x12 = 0xffff;
    }
    eVar5._M_cat._0_4_ = iVar1;
    eVar5._0_8_ = this;
    eVar5._M_cat._4_4_ = 0;
    errorCodeToError(eVar5);
    return (Error)(ErrorInfoBase *)this;
  }
  __assert_fail("!Done",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                ,0x47a,"Error llvm::sys::fs::TempFile::keep(const Twine &)");
}

Assistant:

Error TempFile::keep(const Twine &Name) {
  assert(!Done);
  Done = true;
  // Always try to close and rename.
#ifdef _WIN32
  // If we can't cancel the delete don't rename.
  auto H = reinterpret_cast<HANDLE>(_get_osfhandle(FD));
  std::error_code RenameEC = setDeleteDisposition(H, false);
  if (!RenameEC)
    RenameEC = rename_fd(FD, Name);
  // If we can't rename, discard the temporary file.
  if (RenameEC)
    setDeleteDisposition(H, true);
#else
  std::error_code RenameEC = fs::rename(TmpName, Name);
  if (RenameEC) {
    // If we can't rename, try to copy to work around cross-device link issues.
    RenameEC = sys::fs::copy_file(TmpName, Name);
    // If we can't rename or copy, discard the temporary file.
    if (RenameEC)
      remove(TmpName);
  }
  sys::DontRemoveFileOnSignal(TmpName);
#endif

  if (!RenameEC)
    TmpName = "";

  if (close(FD) == -1) {
    std::error_code EC(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return errorCodeToError(RenameEC);
}